

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Decrement_InPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  JavascriptNumber *pJVar3;
  double value;
  
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    pvVar2 = TaggedInt::Decrement(aRight,scriptContext);
    return pvVar2;
  }
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    pvVar2 = JavascriptBigInt::Decrement(aRight);
    return pvVar2;
  }
  value = Decrement_Helper(aRight,scriptContext);
  pJVar3 = JavascriptNumber::InPlaceNew(value,scriptContext,result);
  return pJVar3;
}

Assistant:

Var JavascriptMath::Decrement_InPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_DecrementInPlace);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Decrement(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Decrement(aRight);
            }

            double dec = Decrement_Helper(aRight,scriptContext);
            return JavascriptNumber::InPlaceNew(dec, scriptContext, result);
            JIT_HELPER_END(Op_DecrementInPlace);
        }